

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

uint32 __thiscall TTD::TTEventList::Count(TTEventList *this)

{
  EventLogEntry *data;
  size_t cpos;
  TTEventListLink *curr;
  uint32 count;
  TTEventList *this_local;
  
  curr._4_4_ = 0;
  for (cpos = (size_t)this->m_headBlock; cpos != 0; cpos = *(size_t *)(cpos + 0x20)) {
    for (data = *(EventLogEntry **)(cpos + 8); data != *(EventLogEntry **)cpos;
        data = (EventLogEntry *)
               ((long)&data->EventKind +
               this->m_vtable[*(uint *)((long)&data->EventKind + *(long *)(cpos + 0x10))].DataSize))
    {
      curr._4_4_ = curr._4_4_ + 1;
    }
  }
  return curr._4_4_;
}

Assistant:

uint32 TTEventList::Count() const
    {
        uint32 count = 0;

        for(TTEventListLink* curr = this->m_headBlock; curr != nullptr; curr = curr->Previous)
        {
            size_t cpos = curr->StartPos;
            while(cpos != curr->CurrPos)
            {
                count++;

                NSLogEvents::EventLogEntry* data = reinterpret_cast<NSLogEvents::EventLogEntry*>(curr->BlockData + cpos);
                cpos += this->m_vtable[(uint32)data->EventKind].DataSize;
            }
        }

        return count;
    }